

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O1

uint64_t __thiscall roaring::Roaring64Map::cardinality(Roaring64Map *this)

{
  bool bVar1;
  uint64_t uVar2;
  _Rb_tree_node_base *p_Var3;
  length_error *this_00;
  uint64_t uVar4;
  
  bVar1 = isFull(this);
  if (bVar1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,
               "bitmap is full, cardinality is 2^64, unable to represent in a 64-bit integer");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  uVar4 = 0;
  for (p_Var3 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    uVar2 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var3[1]._M_parent);
    uVar4 = uVar4 + uVar2;
  }
  return uVar4;
}

Assistant:

uint64_t cardinality() const {
        if (isFull()) {
#if ROARING_EXCEPTIONS
            throw std::length_error(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#else
            ROARING_TERMINATE(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#endif
        }
        return std::accumulate(
            roarings.cbegin(), roarings.cend(), (uint64_t)0,
            [](uint64_t previous,
               const std::pair<const uint32_t, Roaring> &map_entry) {
                return previous + map_entry.second.cardinality();
            });
    }